

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::AddFunction(ExpressionContext *this,FunctionData *function)

{
  ScopeData *pSVar1;
  uint uVar2;
  IdentifierLookupResult local_38;
  IdentifierLookupResult local_28;
  FunctionData *local_18;
  FunctionData *function_local;
  ExpressionContext *this_local;
  
  local_18 = function;
  function_local = (FunctionData *)this;
  SmallArray<FunctionData_*,_2U>::push_back(&this->scope->functions,&local_18);
  uVar2 = SmallArray<FunctionData_*,_128U>::size(&this->functions);
  local_18->functionIndex = uVar2;
  SmallArray<FunctionData_*,_128U>::push_back(&this->functions,&local_18);
  if (((local_18->name->name).begin != (char *)0x0) && (*(local_18->name->name).begin != '$')) {
    if ((this->scope->type == SCOPE_TYPE) || (this->scope->type == SCOPE_NAMESPACE)) {
      pSVar1 = this->globalScope;
      uVar2 = InplaceStr::hash(&local_18->name->name);
      IdentifierLookupResult::IdentifierLookupResult(&local_28,local_18);
      DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar2,local_28);
    }
    else {
      pSVar1 = this->scope;
      uVar2 = InplaceStr::hash(&local_18->name->name);
      IdentifierLookupResult::IdentifierLookupResult(&local_38,local_18);
      DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar2,local_38);
    }
  }
  return;
}

Assistant:

void ExpressionContext::AddFunction(FunctionData *function)
{
	scope->functions.push_back(function);

	function->functionIndex = functions.size();

	functions.push_back(function);

	// Don't add internal functions to named lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		// Type functions are available globally through member accessand namespaced functions are globally accessible through namespace name
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			scope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
	}
}